

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMapType
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          LocationRecorder *type_name_location)

{
  bool bVar1;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  ErrorMaker local_60;
  ErrorMaker local_50;
  ErrorMaker local_40;
  LocationRecorder *local_30;
  LocationRecorder *type_name_location_local;
  FieldDescriptorProto *field_local;
  MapField *map_field_local;
  Parser *this_local;
  
  local_30 = type_name_location;
  type_name_location_local = (LocationRecorder *)field;
  field_local = (FieldDescriptorProto *)map_field;
  map_field_local = (MapField *)this;
  bVar1 = FieldDescriptorProto::has_oneof_index(field);
  if (bVar1) {
    ErrorMaker::ErrorMaker(&local_40,"Map fields are not allowed in oneofs.");
    RecordError(this,local_40);
    this_local._7_1_ = false;
  }
  else {
    bVar1 = FieldDescriptorProto::has_label((FieldDescriptorProto *)type_name_location_local);
    if (bVar1) {
      ErrorMaker::ErrorMaker
                (&local_50,
                 "Field labels (required/optional/repeated) are not allowed on map fields.");
      RecordError(this,local_50);
      this_local._7_1_ = false;
    }
    else {
      bVar1 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)type_name_location_local);
      if (bVar1) {
        ErrorMaker::ErrorMaker(&local_60,"Map fields are not allowed to be extensions.");
        RecordError(this,local_60);
        this_local._7_1_ = false;
      }
      else {
        FieldDescriptorProto::set_label
                  ((FieldDescriptorProto *)type_name_location_local,
                   FieldDescriptorProto_Label_LABEL_REPEATED);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"<");
        bVar1 = Consume(this,local_70);
        if (bVar1) {
          bVar1 = ParseType(this,(Type *)((long)&(field_local->super_Message).super_MessageLite.
                                                 _vptr_MessageLite + 4),
                            (string *)&(field_local->field_0)._impl_);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,",");
            bVar1 = Consume(this,local_80);
            if (bVar1) {
              bVar1 = ParseType(this,(Type *)&(field_local->super_Message).super_MessageLite.
                                              _internal_metadata_,
                                (string *)&(field_local->field_0)._impl_.default_value_);
              if (bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_90,">");
                bVar1 = Consume(this,local_90);
                if (bVar1) {
                  LocationRecorder::AddPath(local_30,6);
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseMapType(MapField* map_field, FieldDescriptorProto* field,
                          LocationRecorder& type_name_location) {
  if (field->has_oneof_index()) {
    RecordError("Map fields are not allowed in oneofs.");
    return false;
  }
  if (field->has_label()) {
    RecordError(
        "Field labels (required/optional/repeated) are not allowed on "
        "map fields.");
    return false;
  }
  if (field->has_extendee()) {
    RecordError("Map fields are not allowed to be extensions.");
    return false;
  }
  field->set_label(FieldDescriptorProto::LABEL_REPEATED);
  DO(Consume("<"));
  DO(ParseType(&map_field->key_type, &map_field->key_type_name));
  DO(Consume(","));
  DO(ParseType(&map_field->value_type, &map_field->value_type_name));
  DO(Consume(">"));
  // Defer setting of the type name of the map field until the
  // field name is parsed. Add the source location though.
  type_name_location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
  return true;
}